

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  int iVar1;
  type_conflict5 tVar2;
  bool bVar3;
  VarStatus VVar4;
  double *pdVar5;
  SPxInternalCodeException *pSVar6;
  long lVar7;
  pointer pnVar8;
  cpp_dec_float<200U,_int,_void> *pcVar9;
  uint *puVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  pointer pnVar15;
  soplex *psVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  ulong uVar19;
  long lVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_26;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_24;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1eb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1db0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1cb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_19b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_18b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_17b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_16b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_15b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_14b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13b0;
  cpp_dec_float<200U,_int,_void> local_1330;
  cpp_dec_float<200U,_int,_void> local_12b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_11b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10b0;
  undefined1 local_1030 [128];
  soplex local_fb0 [112];
  int local_f40;
  undefined1 local_f3c;
  undefined8 local_f38;
  uint local_f30 [28];
  int local_ec0;
  undefined1 local_ebc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_eb8;
  soplex local_eb0 [112];
  int local_e40;
  undefined1 local_e3c;
  undefined8 local_e38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e30;
  cpp_dec_float<200U,_int,_void> local_db0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_cb0;
  cpp_dec_float<200U,_int,_void> local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  cpp_dec_float<200U,_int,_void> local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  cpp_dec_float<200U,_int,_void> local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar21 = 0;
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    uVar19 = (ulong)(uint)(this->m_perm).thesize;
    lVar7 = uVar19 << 7;
    for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
      lVar20 = (long)(this->m_perm).data[uVar19 - 1];
      if (-1 < lVar20) {
        pnVar8 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)pnVar8[-1].m_backend.data._M_elems + lVar7),&pnVar8[lVar20].m_backend);
        pnVar8 = (r->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)
                   ((long)pnVar8[-1].m_backend.data._M_elems + lVar7),&pnVar8[lVar20].m_backend);
        cStatus->data[uVar19 - 1] = cStatus->data[lVar20];
      }
      lVar7 = lVar7 + -0x80;
    }
    return;
  }
  iVar1 = this->m_k;
  switch(cStatus->data[iVar1]) {
  case ON_UPPER:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&(this->m_upK).m_backend)
    ;
    scale1.m_backend.data._M_elems._0_8_ = (ulong)scale1.m_backend.data._M_elems[1] << 0x20;
    tVar2 = boost::multiprecision::operator>(&this->m_scale,(int *)&scale1);
    pcVar14 = &(x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    if (!tVar2) goto LAB_0042506d;
LAB_004256cb:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (pcVar14,&(this->m_upJ).m_backend);
    bVar3 = boost::multiprecision::operator==(&this->m_loJ,&this->m_upJ);
    VVar4 = (uint)bVar3 * 2;
    goto LAB_004256eb;
  case ON_LOWER:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&(this->m_loK).m_backend)
    ;
    scale1.m_backend.data._M_elems._0_8_ = (ulong)scale1.m_backend.data._M_elems[1] << 0x20;
    tVar2 = boost::multiprecision::operator>(&this->m_scale,(int *)&scale1);
    pcVar14 = &(x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    if (!tVar2) goto LAB_004256cb;
LAB_0042506d:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (pcVar14,&(this->m_loJ).m_backend);
    bVar3 = boost::multiprecision::operator==(&this->m_loJ,&this->m_upJ);
    VVar4 = bVar3 + ON_LOWER;
LAB_004256eb:
    cStatus->data[this->m_j] = VVar4;
    break;
  case FIXED:
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
               &(this->m_loJ).m_backend);
    cStatus->data[this->m_j] = FIXED;
    break;
  case ZERO:
    pnVar13 = &this->m_loK;
    pnVar12 = pnVar13;
    puVar10 = local_b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      *puVar10 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar12->m_backend).data._M_elems + 1);
      puVar10 = puVar10 + 1;
    }
    local_40 = (this->m_loK).m_backend.exp;
    local_3c = (this->m_loK).m_backend.neg;
    local_38._0_4_ = (this->m_loK).m_backend.fpclass;
    local_38._4_4_ = (this->m_loK).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_130,this);
    bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_b0,&local_130);
    if (bVar3) {
      pnVar12 = &this->m_upK;
      pnVar11 = &local_1b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (this->m_upK).m_backend.exp;
      local_1b0.m_backend.neg = (this->m_upK).m_backend.neg;
      local_1b0.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
      local_1b0.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_230,this);
      bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1b0,&local_230);
      if ((!bVar3) || (bVar3 = boost::multiprecision::operator==(pnVar13,&this->m_upK), !bVar3))
      goto LAB_004258a0;
      VVar4 = FIXED;
    }
    else {
LAB_004258a0:
      pnVar12 = pnVar13;
      pnVar11 = &local_2b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = (this->m_loK).m_backend.exp;
      local_2b0.m_backend.neg = (this->m_loK).m_backend.neg;
      local_2b0.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
      local_2b0.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_330,this);
      bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b0,&local_330);
      if (bVar3) {
        VVar4 = ON_LOWER;
      }
      else {
        pnVar12 = &this->m_upK;
        pnVar11 = &local_3b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_3b0.m_backend.exp = (this->m_upK).m_backend.exp;
        local_3b0.m_backend.neg = (this->m_upK).m_backend.neg;
        local_3b0.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
        local_3b0.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_430,this);
        bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_3b0,&local_430);
        VVar4 = ON_UPPER;
        if (!bVar3) {
          pnVar12 = &local_4b0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_4b0.m_backend.exp = (this->m_loK).m_backend.exp;
          local_4b0.m_backend.neg = (this->m_loK).m_backend.neg;
          local_4b0.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          local_4b0.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_530,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_5b0,this);
          bVar3 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_4b0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_530,&local_5b0);
          if (!bVar3) {
LAB_00426d96:
            pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&scale1,"XMAISM05 This should never happen.",(allocator *)&scale2);
            SPxInternalCodeException::SPxInternalCodeException(pSVar6,(string *)&scale1);
            __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          pnVar13 = &this->m_upK;
          pnVar12 = &local_630;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_630.m_backend.exp = (this->m_upK).m_backend.exp;
          local_630.m_backend.neg = (this->m_upK).m_backend.neg;
          local_630.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          local_630.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_6b0,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_730,this);
          bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_630,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_6b0,&local_730);
          if (!bVar3) goto LAB_00426d96;
          VVar4 = ZERO;
        }
      }
    }
    cStatus->data[this->m_k] = VVar4;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)
               ((x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
    pnVar13 = &this->m_loJ;
    pnVar12 = pnVar13;
    pnVar11 = &local_7b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_7b0.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_7b0.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_7b0.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_7b0.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_830,this);
    bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_7b0,&local_830);
    if (bVar3) {
      pnVar12 = &this->m_upJ;
      pnVar11 = &local_8b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_8b0.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_8b0.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_8b0.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_8b0.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_930,this);
      bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_8b0,&local_930);
      if ((bVar3) && (bVar3 = boost::multiprecision::operator==(pnVar13,&this->m_upJ), bVar3)) {
        cStatus->data[this->m_j] = FIXED;
        break;
      }
    }
    pnVar12 = pnVar13;
    pnVar11 = &local_9b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_9b0.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_9b0.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_9b0.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_9b0.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_a30,this);
    bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_9b0,&local_a30);
    if (bVar3) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      pnVar12 = &this->m_upJ;
      pnVar11 = &local_ab0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar11->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar21 * -8 + 4);
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_ab0.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_ab0.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_ab0.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_ab0.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_b30,this);
      bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_ab0,&local_b30);
      if (!bVar3) {
        pnVar12 = &local_bb0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_bb0.m_backend.exp = (this->m_loJ).m_backend.exp;
        local_bb0.m_backend.neg = (this->m_loJ).m_backend.neg;
        local_bb0.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
        local_bb0.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_c30,0.0,(type *)0x0);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_cb0,this);
        bVar3 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_bb0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_c30,&local_cb0);
        if (bVar3) {
          pnVar13 = &this->m_upJ;
          pnVar12 = &local_d30;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
            pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar13 + (ulong)bVar21 * -8 + 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_d30.m_backend.exp = (this->m_upJ).m_backend.exp;
          local_d30.m_backend.neg = (this->m_upJ).m_backend.neg;
          local_d30.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
          local_d30.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_db0,0.0,(type *)0x0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_e30,this);
          bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_d30,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_db0,&local_e30);
          if (bVar3) {
            cStatus->data[this->m_j] = ZERO;
            break;
          }
        }
        pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&scale1,"XMAISM06 This should never happen.",(allocator *)&scale2);
        SPxInternalCodeException::SPxInternalCodeException(pSVar6,(string *)&scale1);
        __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    break;
  case BASIC:
    pnVar8 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = 0x1c;
    puVar10 = (uint *)(pnVar8 + iVar1);
    psVar16 = local_eb0;
    for (lVar20 = lVar7; lVar20 != 0; lVar20 = lVar20 + -1) {
      *(uint *)psVar16 = *puVar10;
      puVar10 = puVar10 + 1;
      psVar16 = psVar16 + 4;
    }
    local_e40 = pnVar8[iVar1].m_backend.exp;
    local_e3c = pnVar8[iVar1].m_backend.neg;
    local_e38._0_4_ = pnVar8[iVar1].m_backend.fpclass;
    local_e38._4_4_ = pnVar8[iVar1].m_backend.prec_elem;
    pnVar13 = &this->m_loK;
    pnVar12 = pnVar13;
    puVar10 = local_f30;
    for (lVar20 = lVar7; lVar20 != 0; lVar20 = lVar20 + -1) {
      *puVar10 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar12->m_backend).data._M_elems + 1);
      puVar10 = puVar10 + 1;
    }
    local_ec0 = (this->m_loK).m_backend.exp;
    local_ebc = (this->m_loK).m_backend.neg;
    local_eb8 = *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  **)&(this->m_loK).m_backend.fpclass;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&scale1,local_eb0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_f30,local_eb8);
    iVar1 = this->m_k;
    pnVar8 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar15 = pnVar8 + iVar1;
    psVar16 = local_fb0;
    for (lVar20 = lVar7; lVar20 != 0; lVar20 = lVar20 + -1) {
      *(undefined4 *)psVar16 = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
      psVar16 = psVar16 + (ulong)bVar21 * -8 + 4;
    }
    local_f40 = pnVar8[iVar1].m_backend.exp;
    local_f3c = pnVar8[iVar1].m_backend.neg;
    local_f38._0_4_ = pnVar8[iVar1].m_backend.fpclass;
    local_f38._4_4_ = pnVar8[iVar1].m_backend.prec_elem;
    pnVar12 = &this->m_upK;
    pnVar11 = pnVar12;
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_1030;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + (ulong)bVar21 * -8 + 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_1030._112_4_ = (this->m_upK).m_backend.exp;
    local_1030[0x74] = (this->m_upK).m_backend.neg;
    local_1030._120_8_ = *(undefined8 *)&(this->m_upK).m_backend.fpclass;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&scale2,local_fb0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_1030,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_1030._120_8_);
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0x3ff00000;
    tVar2 = boost::multiprecision::operator<(&scale1,(double *)&z1);
    if (tVar2) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&scale1,1.0);
    }
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0x3ff00000;
    tVar2 = boost::multiprecision::operator<(&scale2,(double *)&z1);
    if (tVar2) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&scale2,1.0);
    }
    z2.m_backend.fpclass = cpp_dec_float_finite;
    z2.m_backend.prec_elem = 0x1c;
    z2.m_backend.data._M_elems[0] = 0;
    z2.m_backend.data._M_elems[1] = 0;
    z2.m_backend.data._M_elems[2] = 0;
    z2.m_backend.data._M_elems[3] = 0;
    z2.m_backend.data._M_elems[4] = 0;
    z2.m_backend.data._M_elems[5] = 0;
    z2.m_backend.data._M_elems[6] = 0;
    z2.m_backend.data._M_elems[7] = 0;
    z2.m_backend.data._M_elems[8] = 0;
    z2.m_backend.data._M_elems[9] = 0;
    z2.m_backend.data._M_elems[10] = 0;
    z2.m_backend.data._M_elems[0xb] = 0;
    z2.m_backend.data._M_elems[0xc] = 0;
    z2.m_backend.data._M_elems[0xd] = 0;
    z2.m_backend.data._M_elems[0xe] = 0;
    z2.m_backend.data._M_elems[0xf] = 0;
    z2.m_backend.data._M_elems[0x10] = 0;
    z2.m_backend.data._M_elems[0x11] = 0;
    z2.m_backend.data._M_elems[0x12] = 0;
    z2.m_backend.data._M_elems[0x13] = 0;
    z2.m_backend.data._M_elems[0x14] = 0;
    z2.m_backend.data._M_elems[0x15] = 0;
    z2.m_backend.data._M_elems[0x16] = 0;
    z2.m_backend.data._M_elems[0x17] = 0;
    z2.m_backend.data._M_elems[0x18] = 0;
    z2.m_backend.data._M_elems[0x19] = 0;
    z2.m_backend.data._M_elems._104_5_ = 0;
    z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    z2.m_backend.exp = 0;
    z2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&z2.m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&scale1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,&pnVar13->m_backend,&scale1.m_backend);
    z1.m_backend.fpclass = cpp_dec_float_finite;
    z1.m_backend.prec_elem = 0x1c;
    z1.m_backend.data._M_elems[0] = 0;
    z1.m_backend.data._M_elems[1] = 0;
    z1.m_backend.data._M_elems[2] = 0;
    z1.m_backend.data._M_elems[3] = 0;
    z1.m_backend.data._M_elems[4] = 0;
    z1.m_backend.data._M_elems[5] = 0;
    z1.m_backend.data._M_elems[6] = 0;
    z1.m_backend.data._M_elems[7] = 0;
    z1.m_backend.data._M_elems[8] = 0;
    z1.m_backend.data._M_elems[9] = 0;
    z1.m_backend.data._M_elems[10] = 0;
    z1.m_backend.data._M_elems[0xb] = 0;
    z1.m_backend.data._M_elems[0xc] = 0;
    z1.m_backend.data._M_elems[0xd] = 0;
    z1.m_backend.data._M_elems[0xe] = 0;
    z1.m_backend.data._M_elems[0xf] = 0;
    z1.m_backend.data._M_elems[0x10] = 0;
    z1.m_backend.data._M_elems[0x11] = 0;
    z1.m_backend.data._M_elems[0x12] = 0;
    z1.m_backend.data._M_elems[0x13] = 0;
    z1.m_backend.data._M_elems[0x14] = 0;
    z1.m_backend.data._M_elems[0x15] = 0;
    z1.m_backend.data._M_elems[0x16] = 0;
    z1.m_backend.data._M_elems[0x17] = 0;
    z1.m_backend.data._M_elems[0x18] = 0;
    z1.m_backend.data._M_elems[0x19] = 0;
    z1.m_backend.data._M_elems._104_5_ = 0;
    z1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    z1.m_backend.exp = 0;
    z1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&z1.m_backend,&z2.m_backend,&result_1.m_backend);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&scale2.m_backend);
    result_4.m_backend.fpclass = cpp_dec_float_finite;
    result_4.m_backend.prec_elem = 0x1c;
    result_4.m_backend.data._M_elems[0] = 0;
    result_4.m_backend.data._M_elems[1] = 0;
    result_4.m_backend.data._M_elems[2] = 0;
    result_4.m_backend.data._M_elems[3] = 0;
    result_4.m_backend.data._M_elems[4] = 0;
    result_4.m_backend.data._M_elems[5] = 0;
    result_4.m_backend.data._M_elems[6] = 0;
    result_4.m_backend.data._M_elems[7] = 0;
    result_4.m_backend.data._M_elems[8] = 0;
    result_4.m_backend.data._M_elems[9] = 0;
    result_4.m_backend.data._M_elems[10] = 0;
    result_4.m_backend.data._M_elems[0xb] = 0;
    result_4.m_backend.data._M_elems[0xc] = 0;
    result_4.m_backend.data._M_elems[0xd] = 0;
    result_4.m_backend.data._M_elems[0xe] = 0;
    result_4.m_backend.data._M_elems[0xf] = 0;
    result_4.m_backend.data._M_elems[0x10] = 0;
    result_4.m_backend.data._M_elems[0x11] = 0;
    result_4.m_backend.data._M_elems[0x12] = 0;
    result_4.m_backend.data._M_elems[0x13] = 0;
    result_4.m_backend.data._M_elems[0x14] = 0;
    result_4.m_backend.data._M_elems[0x15] = 0;
    result_4.m_backend.data._M_elems[0x16] = 0;
    result_4.m_backend.data._M_elems[0x17] = 0;
    result_4.m_backend.data._M_elems[0x18] = 0;
    result_4.m_backend.data._M_elems[0x19] = 0;
    result_4.m_backend.data._M_elems._104_5_ = 0;
    result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_4.m_backend.exp = 0;
    result_4.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_4.m_backend,&pnVar12->m_backend,&scale2.m_backend);
    z2.m_backend.fpclass = cpp_dec_float_finite;
    z2.m_backend.prec_elem = 0x1c;
    z2.m_backend.data._M_elems[0] = 0;
    z2.m_backend.data._M_elems[1] = 0;
    z2.m_backend.data._M_elems[2] = 0;
    z2.m_backend.data._M_elems[3] = 0;
    z2.m_backend.data._M_elems[4] = 0;
    z2.m_backend.data._M_elems[5] = 0;
    z2.m_backend.data._M_elems[6] = 0;
    z2.m_backend.data._M_elems[7] = 0;
    z2.m_backend.data._M_elems[8] = 0;
    z2.m_backend.data._M_elems[9] = 0;
    z2.m_backend.data._M_elems[10] = 0;
    z2.m_backend.data._M_elems[0xb] = 0;
    z2.m_backend.data._M_elems[0xc] = 0;
    z2.m_backend.data._M_elems[0xd] = 0;
    z2.m_backend.data._M_elems[0xe] = 0;
    z2.m_backend.data._M_elems[0xf] = 0;
    z2.m_backend.data._M_elems[0x10] = 0;
    z2.m_backend.data._M_elems[0x11] = 0;
    z2.m_backend.data._M_elems[0x12] = 0;
    z2.m_backend.data._M_elems[0x13] = 0;
    z2.m_backend.data._M_elems[0x14] = 0;
    z2.m_backend.data._M_elems[0x15] = 0;
    z2.m_backend.data._M_elems[0x16] = 0;
    z2.m_backend.data._M_elems[0x17] = 0;
    z2.m_backend.data._M_elems[0x18] = 0;
    z2.m_backend.data._M_elems[0x19] = 0;
    z2.m_backend.data._M_elems._104_5_ = 0;
    z2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    z2.m_backend.exp = 0;
    z2.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&z2.m_backend,&result_1.m_backend,&result_4.m_backend);
    pcVar14 = &z1.m_backend;
    pnVar11 = &local_10b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_10b0.m_backend.exp = z1.m_backend.exp;
    local_10b0.m_backend.neg = z1.m_backend.neg;
    local_10b0.m_backend.fpclass = z1.m_backend.fpclass;
    local_10b0.m_backend.prec_elem = z1.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_1130,this);
    bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_10b0,&local_1130);
    if (bVar3) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&z1,0.0);
    }
    pnVar11 = &z2;
    pnVar17 = &local_11b0;
    for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar21 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_11b0.m_backend.exp = z2.m_backend.exp;
    local_11b0.m_backend.neg = z2.m_backend.neg;
    local_11b0.m_backend.fpclass = z2.m_backend.fpclass;
    local_11b0.m_backend.prec_elem = z2.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_1230,this);
    bVar3 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_11b0,&local_1230);
    if (bVar3) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&z2,0.0);
    }
    pcVar14 = &(this->m_loJ).m_backend;
    pdVar5 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&result_1.m_backend,-*pdVar5,(type *)0x0);
    tVar2 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)pcVar14,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_1.m_backend);
    if (tVar2) {
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&result_4.m_backend,*pdVar5,(type *)0x0);
      tVar2 = boost::multiprecision::operator>=
                        (&this->m_upJ,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_4.m_backend);
      if (tVar2) {
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_12b0,-*pdVar5,(type *)0x0);
        tVar2 = boost::multiprecision::operator<=
                          (pnVar13,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_12b0);
        if (tVar2) {
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_1330,*pdVar5,(type *)0x0);
          tVar2 = boost::multiprecision::operator>=
                            (pnVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_1330);
          if (tVar2) {
            iVar1 = this->m_j;
            cStatus->data[iVar1] = ZERO;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)
                       ((x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar1),0.0);
            break;
          }
        }
      }
    }
    pnVar11 = &this->m_scale;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    tVar2 = boost::multiprecision::operator>(pnVar11,(double *)&result_1);
    pnVar8 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_k;
    if (tVar2) {
      pnVar15 = pnVar8;
      pnVar17 = &local_13b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_13b0.m_backend.exp = (pnVar8->m_backend).exp;
      local_13b0.m_backend.neg = (pnVar8->m_backend).neg;
      local_13b0.m_backend.fpclass = (pnVar8->m_backend).fpclass;
      local_13b0.m_backend.prec_elem = (pnVar8->m_backend).prec_elem;
      pnVar17 = &this->m_upJ;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&pnVar11->m_backend,&pnVar17->m_backend);
      result_5.m_backend.fpclass = cpp_dec_float_finite;
      result_5.m_backend.prec_elem = 0x1c;
      result_5.m_backend.data._M_elems[0] = 0;
      result_5.m_backend.data._M_elems[1] = 0;
      result_5.m_backend.data._M_elems[2] = 0;
      result_5.m_backend.data._M_elems[3] = 0;
      result_5.m_backend.data._M_elems[4] = 0;
      result_5.m_backend.data._M_elems[5] = 0;
      result_5.m_backend.data._M_elems[6] = 0;
      result_5.m_backend.data._M_elems[7] = 0;
      result_5.m_backend.data._M_elems[8] = 0;
      result_5.m_backend.data._M_elems[9] = 0;
      result_5.m_backend.data._M_elems[10] = 0;
      result_5.m_backend.data._M_elems[0xb] = 0;
      result_5.m_backend.data._M_elems[0xc] = 0;
      result_5.m_backend.data._M_elems[0xd] = 0;
      result_5.m_backend.data._M_elems[0xe] = 0;
      result_5.m_backend.data._M_elems[0xf] = 0;
      result_5.m_backend.data._M_elems[0x10] = 0;
      result_5.m_backend.data._M_elems[0x11] = 0;
      result_5.m_backend.data._M_elems[0x12] = 0;
      result_5.m_backend.data._M_elems[0x13] = 0;
      result_5.m_backend.data._M_elems[0x14] = 0;
      result_5.m_backend.data._M_elems[0x15] = 0;
      result_5.m_backend.data._M_elems[0x16] = 0;
      result_5.m_backend.data._M_elems[0x17] = 0;
      result_5.m_backend.data._M_elems[0x18] = 0;
      result_5.m_backend.data._M_elems[0x19] = 0;
      result_5.m_backend.data._M_elems._104_5_ = 0;
      result_5.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_5.m_backend.exp = 0;
      result_5.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_5.m_backend,&pnVar12->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_1430,this);
      bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_13b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_5.m_backend,&local_1430);
      if (bVar3) {
        bVar3 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,pnVar17);
        iVar1 = this->m_j;
        cStatus->data[iVar1] = (uint)bVar3 * 2;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,&pnVar17->m_backend);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&pnVar11->m_backend,
                   &(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
        pcVar14 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
LAB_00426cfd:
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (pcVar14,&result_1.m_backend);
        break;
      }
      iVar1 = this->m_k;
      pnVar8 = (x->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar15 = pnVar8 + iVar1;
      pnVar18 = &local_14b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_14b0.m_backend.exp = pnVar8[iVar1].m_backend.exp;
      local_14b0.m_backend.neg = pnVar8[iVar1].m_backend.neg;
      local_14b0.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
      local_14b0.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&pnVar11->m_backend,&pnVar17->m_backend);
      result_8.m_backend.fpclass = cpp_dec_float_finite;
      result_8.m_backend.prec_elem = 0x1c;
      result_8.m_backend.data._M_elems[0] = 0;
      result_8.m_backend.data._M_elems[1] = 0;
      result_8.m_backend.data._M_elems[2] = 0;
      result_8.m_backend.data._M_elems[3] = 0;
      result_8.m_backend.data._M_elems[4] = 0;
      result_8.m_backend.data._M_elems[5] = 0;
      result_8.m_backend.data._M_elems[6] = 0;
      result_8.m_backend.data._M_elems[7] = 0;
      result_8.m_backend.data._M_elems[8] = 0;
      result_8.m_backend.data._M_elems[9] = 0;
      result_8.m_backend.data._M_elems[10] = 0;
      result_8.m_backend.data._M_elems[0xb] = 0;
      result_8.m_backend.data._M_elems[0xc] = 0;
      result_8.m_backend.data._M_elems[0xd] = 0;
      result_8.m_backend.data._M_elems[0xe] = 0;
      result_8.m_backend.data._M_elems[0xf] = 0;
      result_8.m_backend.data._M_elems[0x10] = 0;
      result_8.m_backend.data._M_elems[0x11] = 0;
      result_8.m_backend.data._M_elems[0x12] = 0;
      result_8.m_backend.data._M_elems[0x13] = 0;
      result_8.m_backend.data._M_elems[0x14] = 0;
      result_8.m_backend.data._M_elems[0x15] = 0;
      result_8.m_backend.data._M_elems[0x16] = 0;
      result_8.m_backend.data._M_elems[0x17] = 0;
      result_8.m_backend.data._M_elems[0x18] = 0;
      result_8.m_backend.data._M_elems[0x19] = 0;
      result_8.m_backend.data._M_elems._104_5_ = 0;
      result_8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_8.m_backend.exp = 0;
      result_8.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_8.m_backend,&pnVar13->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_1530,this);
      bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_14b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_8.m_backend,&local_1530);
      if (bVar3) {
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&result_4.m_backend,*pdVar5,(type *)0x0);
        tVar2 = boost::multiprecision::operator<
                          (pnVar17,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&result_4.m_backend);
        if (!tVar2) goto LAB_00425eb0;
LAB_00426793:
        bVar3 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,&this->m_upJ);
        VVar4 = (uint)bVar3 * 2;
        pcVar14 = &(this->m_upJ).m_backend;
      }
      else {
LAB_00425eb0:
        iVar1 = this->m_k;
        pnVar8 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar8 + iVar1;
        pnVar18 = &local_15b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_15b0.m_backend.exp = pnVar8[iVar1].m_backend.exp;
        local_15b0.m_backend.neg = pnVar8[iVar1].m_backend.neg;
        local_15b0.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
        local_15b0.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&pnVar11->m_backend,pcVar14);
        result_10.m_backend.fpclass = cpp_dec_float_finite;
        result_10.m_backend.prec_elem = 0x1c;
        result_10.m_backend.data._M_elems[0] = 0;
        result_10.m_backend.data._M_elems[1] = 0;
        result_10.m_backend.data._M_elems[2] = 0;
        result_10.m_backend.data._M_elems[3] = 0;
        result_10.m_backend.data._M_elems[4] = 0;
        result_10.m_backend.data._M_elems[5] = 0;
        result_10.m_backend.data._M_elems[6] = 0;
        result_10.m_backend.data._M_elems[7] = 0;
        result_10.m_backend.data._M_elems[8] = 0;
        result_10.m_backend.data._M_elems[9] = 0;
        result_10.m_backend.data._M_elems[10] = 0;
        result_10.m_backend.data._M_elems[0xb] = 0;
        result_10.m_backend.data._M_elems[0xc] = 0;
        result_10.m_backend.data._M_elems[0xd] = 0;
        result_10.m_backend.data._M_elems[0xe] = 0;
        result_10.m_backend.data._M_elems[0xf] = 0;
        result_10.m_backend.data._M_elems[0x10] = 0;
        result_10.m_backend.data._M_elems[0x11] = 0;
        result_10.m_backend.data._M_elems[0x12] = 0;
        result_10.m_backend.data._M_elems[0x13] = 0;
        result_10.m_backend.data._M_elems[0x14] = 0;
        result_10.m_backend.data._M_elems[0x15] = 0;
        result_10.m_backend.data._M_elems[0x16] = 0;
        result_10.m_backend.data._M_elems[0x17] = 0;
        result_10.m_backend.data._M_elems[0x18] = 0;
        result_10.m_backend.data._M_elems[0x19] = 0;
        result_10.m_backend.data._M_elems._104_5_ = 0;
        result_10.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_10.m_backend.exp = 0;
        result_10.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_10.m_backend,&pnVar12->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_1630,this);
        bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_15b0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_10.m_backend,&local_1630);
        if (bVar3) {
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,*pdVar5,(type *)0x0);
          tVar2 = boost::multiprecision::operator<
                            (pnVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_4.m_backend);
          if (tVar2) goto LAB_004265e5;
        }
        iVar1 = this->m_k;
        pnVar8 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar8 + iVar1;
        pnVar18 = &local_16b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_16b0.m_backend.exp = pnVar8[iVar1].m_backend.exp;
        local_16b0.m_backend.neg = pnVar8[iVar1].m_backend.neg;
        local_16b0.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
        local_16b0.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&pnVar11->m_backend,pcVar14);
        result_12.m_backend.fpclass = cpp_dec_float_finite;
        result_12.m_backend.prec_elem = 0x1c;
        result_12.m_backend.data._M_elems[0] = 0;
        result_12.m_backend.data._M_elems[1] = 0;
        result_12.m_backend.data._M_elems[2] = 0;
        result_12.m_backend.data._M_elems[3] = 0;
        result_12.m_backend.data._M_elems[4] = 0;
        result_12.m_backend.data._M_elems[5] = 0;
        result_12.m_backend.data._M_elems[6] = 0;
        result_12.m_backend.data._M_elems[7] = 0;
        result_12.m_backend.data._M_elems[8] = 0;
        result_12.m_backend.data._M_elems[9] = 0;
        result_12.m_backend.data._M_elems[10] = 0;
        result_12.m_backend.data._M_elems[0xb] = 0;
        result_12.m_backend.data._M_elems[0xc] = 0;
        result_12.m_backend.data._M_elems[0xd] = 0;
        result_12.m_backend.data._M_elems[0xe] = 0;
        result_12.m_backend.data._M_elems[0xf] = 0;
        result_12.m_backend.data._M_elems[0x10] = 0;
        result_12.m_backend.data._M_elems[0x11] = 0;
        result_12.m_backend.data._M_elems[0x12] = 0;
        result_12.m_backend.data._M_elems[0x13] = 0;
        result_12.m_backend.data._M_elems[0x14] = 0;
        result_12.m_backend.data._M_elems[0x15] = 0;
        result_12.m_backend.data._M_elems[0x16] = 0;
        result_12.m_backend.data._M_elems[0x17] = 0;
        result_12.m_backend.data._M_elems[0x18] = 0;
        result_12.m_backend.data._M_elems[0x19] = 0;
        result_12.m_backend.data._M_elems._104_5_ = 0;
        result_12.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_12.m_backend.exp = 0;
        result_12.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_12.m_backend,&pnVar13->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_1730,this);
        bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_16b0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_12.m_backend,&local_1730);
        if (bVar3) {
          pdVar5 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result_4.m_backend,-*pdVar5,(type *)0x0);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar14,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_4.m_backend);
          if (!tVar2) goto LAB_004260fc;
        }
        else {
LAB_004260fc:
          iVar1 = this->m_k;
          pnVar8 = (x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar15 = pnVar8 + iVar1;
          pnVar18 = &local_17b0;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_17b0.m_backend.exp = pnVar8[iVar1].m_backend.exp;
          local_17b0.m_backend.neg = pnVar8[iVar1].m_backend.neg;
          local_17b0.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
          local_17b0.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&pnVar11->m_backend,pcVar14);
          result_14.m_backend.fpclass = cpp_dec_float_finite;
          result_14.m_backend.prec_elem = 0x1c;
          result_14.m_backend.data._M_elems[0] = 0;
          result_14.m_backend.data._M_elems[1] = 0;
          result_14.m_backend.data._M_elems[2] = 0;
          result_14.m_backend.data._M_elems[3] = 0;
          result_14.m_backend.data._M_elems[4] = 0;
          result_14.m_backend.data._M_elems[5] = 0;
          result_14.m_backend.data._M_elems[6] = 0;
          result_14.m_backend.data._M_elems[7] = 0;
          result_14.m_backend.data._M_elems[8] = 0;
          result_14.m_backend.data._M_elems[9] = 0;
          result_14.m_backend.data._M_elems[10] = 0;
          result_14.m_backend.data._M_elems[0xb] = 0;
          result_14.m_backend.data._M_elems[0xc] = 0;
          result_14.m_backend.data._M_elems[0xd] = 0;
          result_14.m_backend.data._M_elems[0xe] = 0;
          result_14.m_backend.data._M_elems[0xf] = 0;
          result_14.m_backend.data._M_elems[0x10] = 0;
          result_14.m_backend.data._M_elems[0x11] = 0;
          result_14.m_backend.data._M_elems[0x12] = 0;
          result_14.m_backend.data._M_elems[0x13] = 0;
          result_14.m_backend.data._M_elems[0x14] = 0;
          result_14.m_backend.data._M_elems[0x15] = 0;
          result_14.m_backend.data._M_elems[0x16] = 0;
          result_14.m_backend.data._M_elems[0x17] = 0;
          result_14.m_backend.data._M_elems[0x18] = 0;
          result_14.m_backend.data._M_elems[0x19] = 0;
          result_14.m_backend.data._M_elems._104_5_ = 0;
          result_14.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_14.m_backend.exp = 0;
          result_14.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_14.m_backend,&pnVar13->m_backend,&result_1.m_backend);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_1830,this);
          bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_17b0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_14.m_backend,&local_1830);
          if (bVar3) {
            pdVar5 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_4.m_backend,-*pdVar5,(type *)0x0);
            tVar2 = boost::multiprecision::operator>
                              (pnVar13,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&result_4.m_backend);
            if (tVar2) {
              bVar3 = boost::multiprecision::operator==(pnVar13,pnVar12);
              iVar1 = this->m_k;
              cStatus->data[iVar1] = bVar3 + ON_LOWER;
              pcVar14 = &(x->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend;
              goto LAB_00426903;
            }
          }
          iVar1 = this->m_k;
          pnVar8 = (x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar15 = pnVar8 + iVar1;
          pnVar12 = &local_2538;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_2538.m_backend.exp = pnVar8[iVar1].m_backend.exp;
          local_2538.m_backend.neg = pnVar8[iVar1].m_backend.neg;
          local_2538.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
          local_2538.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&pnVar11->m_backend,pcVar14);
          result_16.m_backend.fpclass = cpp_dec_float_finite;
          result_16.m_backend.prec_elem = 0x1c;
          result_16.m_backend.data._M_elems[0] = 0;
          result_16.m_backend.data._M_elems[1] = 0;
          result_16.m_backend.data._M_elems[2] = 0;
          result_16.m_backend.data._M_elems[3] = 0;
          result_16.m_backend.data._M_elems[4] = 0;
          result_16.m_backend.data._M_elems[5] = 0;
          result_16.m_backend.data._M_elems[6] = 0;
          result_16.m_backend.data._M_elems[7] = 0;
          result_16.m_backend.data._M_elems[8] = 0;
          result_16.m_backend.data._M_elems[9] = 0;
          result_16.m_backend.data._M_elems[10] = 0;
          result_16.m_backend.data._M_elems[0xb] = 0;
          result_16.m_backend.data._M_elems[0xc] = 0;
          result_16.m_backend.data._M_elems[0xd] = 0;
          result_16.m_backend.data._M_elems[0xe] = 0;
          result_16.m_backend.data._M_elems[0xf] = 0;
          result_16.m_backend.data._M_elems[0x10] = 0;
          result_16.m_backend.data._M_elems[0x11] = 0;
          result_16.m_backend.data._M_elems[0x12] = 0;
          result_16.m_backend.data._M_elems[0x13] = 0;
          result_16.m_backend.data._M_elems[0x14] = 0;
          result_16.m_backend.data._M_elems[0x15] = 0;
          result_16.m_backend.data._M_elems[0x16] = 0;
          result_16.m_backend.data._M_elems[0x17] = 0;
          result_16.m_backend.data._M_elems[0x18] = 0;
          result_16.m_backend.data._M_elems[0x19] = 0;
          result_16.m_backend.data._M_elems._104_5_ = 0;
          result_16.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_16.m_backend.exp = 0;
          result_16.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_16.m_backend,&pnVar13->m_backend,&result_1.m_backend);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_18b0,this);
          bVar3 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_2538,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_16.m_backend,&local_18b0);
          if (!bVar3) {
            pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
            std::__cxx11::string::string
                      ((string *)&result_1,"XMAISM08 This should never happen.",
                       (allocator *)&result_4);
            SPxInternalCodeException::SPxInternalCodeException(pSVar6,(string *)&result_1);
            __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
        }
        bVar3 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,pnVar17);
        VVar4 = bVar3 + ON_LOWER;
      }
      iVar1 = this->m_j;
      cStatus->data[iVar1] = VVar4;
      pcVar9 = &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend;
LAB_00426b1a:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar9,pcVar14);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&pnVar11->m_backend,
                 &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
      pcVar14 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
    }
    else {
      pnVar15 = pnVar8;
      pnVar17 = &local_1930;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
        pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_1930.m_backend.exp = (pnVar8->m_backend).exp;
      local_1930.m_backend.neg = (pnVar8->m_backend).neg;
      local_1930.m_backend.fpclass = (pnVar8->m_backend).fpclass;
      local_1930.m_backend.prec_elem = (pnVar8->m_backend).prec_elem;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&pnVar11->m_backend,pcVar14);
      result_17.m_backend.fpclass = cpp_dec_float_finite;
      result_17.m_backend.prec_elem = 0x1c;
      result_17.m_backend.data._M_elems[0] = 0;
      result_17.m_backend.data._M_elems[1] = 0;
      result_17.m_backend.data._M_elems[2] = 0;
      result_17.m_backend.data._M_elems[3] = 0;
      result_17.m_backend.data._M_elems[4] = 0;
      result_17.m_backend.data._M_elems[5] = 0;
      result_17.m_backend.data._M_elems[6] = 0;
      result_17.m_backend.data._M_elems[7] = 0;
      result_17.m_backend.data._M_elems[8] = 0;
      result_17.m_backend.data._M_elems[9] = 0;
      result_17.m_backend.data._M_elems[10] = 0;
      result_17.m_backend.data._M_elems[0xb] = 0;
      result_17.m_backend.data._M_elems[0xc] = 0;
      result_17.m_backend.data._M_elems[0xd] = 0;
      result_17.m_backend.data._M_elems[0xe] = 0;
      result_17.m_backend.data._M_elems[0xf] = 0;
      result_17.m_backend.data._M_elems[0x10] = 0;
      result_17.m_backend.data._M_elems[0x11] = 0;
      result_17.m_backend.data._M_elems[0x12] = 0;
      result_17.m_backend.data._M_elems[0x13] = 0;
      result_17.m_backend.data._M_elems[0x14] = 0;
      result_17.m_backend.data._M_elems[0x15] = 0;
      result_17.m_backend.data._M_elems[0x16] = 0;
      result_17.m_backend.data._M_elems[0x17] = 0;
      result_17.m_backend.data._M_elems[0x18] = 0;
      result_17.m_backend.data._M_elems[0x19] = 0;
      result_17.m_backend.data._M_elems._104_5_ = 0;
      result_17.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_17.m_backend.exp = 0;
      result_17.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_17.m_backend,&pnVar12->m_backend,&result_1.m_backend);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_19b0,this);
      bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1930,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_17.m_backend,&local_19b0);
      if (!bVar3) {
        iVar1 = this->m_k;
        pnVar8 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar15 = pnVar8 + iVar1;
        pnVar17 = &local_1a30;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
          pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1a30.m_backend.exp = pnVar8[iVar1].m_backend.exp;
        local_1a30.m_backend.neg = pnVar8[iVar1].m_backend.neg;
        local_1a30.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
        local_1a30.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,&pnVar11->m_backend,pcVar14);
        result_20.m_backend.fpclass = cpp_dec_float_finite;
        result_20.m_backend.prec_elem = 0x1c;
        result_20.m_backend.data._M_elems[0] = 0;
        result_20.m_backend.data._M_elems[1] = 0;
        result_20.m_backend.data._M_elems[2] = 0;
        result_20.m_backend.data._M_elems[3] = 0;
        result_20.m_backend.data._M_elems[4] = 0;
        result_20.m_backend.data._M_elems[5] = 0;
        result_20.m_backend.data._M_elems[6] = 0;
        result_20.m_backend.data._M_elems[7] = 0;
        result_20.m_backend.data._M_elems[8] = 0;
        result_20.m_backend.data._M_elems[9] = 0;
        result_20.m_backend.data._M_elems[10] = 0;
        result_20.m_backend.data._M_elems[0xb] = 0;
        result_20.m_backend.data._M_elems[0xc] = 0;
        result_20.m_backend.data._M_elems[0xd] = 0;
        result_20.m_backend.data._M_elems[0xe] = 0;
        result_20.m_backend.data._M_elems[0xf] = 0;
        result_20.m_backend.data._M_elems[0x10] = 0;
        result_20.m_backend.data._M_elems[0x11] = 0;
        result_20.m_backend.data._M_elems[0x12] = 0;
        result_20.m_backend.data._M_elems[0x13] = 0;
        result_20.m_backend.data._M_elems[0x14] = 0;
        result_20.m_backend.data._M_elems[0x15] = 0;
        result_20.m_backend.data._M_elems[0x16] = 0;
        result_20.m_backend.data._M_elems[0x17] = 0;
        result_20.m_backend.data._M_elems[0x18] = 0;
        result_20.m_backend.data._M_elems[0x19] = 0;
        result_20.m_backend.data._M_elems._104_5_ = 0;
        result_20.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_20.m_backend.exp = 0;
        result_20.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_20.m_backend,&pnVar13->m_backend,&result_1.m_backend);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_1ab0,this);
        bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1a30,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_20.m_backend,&local_1ab0);
        if (!bVar3) {
LAB_004264bc:
          iVar1 = this->m_k;
          pnVar8 = (x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar15 = pnVar8 + iVar1;
          pnVar17 = &local_1b30;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          local_1b30.m_backend.exp = pnVar8[iVar1].m_backend.exp;
          local_1b30.m_backend.neg = pnVar8[iVar1].m_backend.neg;
          local_1b30.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
          local_1b30.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
          pnVar17 = &this->m_upJ;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&pnVar11->m_backend,&pnVar17->m_backend);
          result_22.m_backend.fpclass = cpp_dec_float_finite;
          result_22.m_backend.prec_elem = 0x1c;
          result_22.m_backend.data._M_elems[0] = 0;
          result_22.m_backend.data._M_elems[1] = 0;
          result_22.m_backend.data._M_elems[2] = 0;
          result_22.m_backend.data._M_elems[3] = 0;
          result_22.m_backend.data._M_elems[4] = 0;
          result_22.m_backend.data._M_elems[5] = 0;
          result_22.m_backend.data._M_elems[6] = 0;
          result_22.m_backend.data._M_elems[7] = 0;
          result_22.m_backend.data._M_elems[8] = 0;
          result_22.m_backend.data._M_elems[9] = 0;
          result_22.m_backend.data._M_elems[10] = 0;
          result_22.m_backend.data._M_elems[0xb] = 0;
          result_22.m_backend.data._M_elems[0xc] = 0;
          result_22.m_backend.data._M_elems[0xd] = 0;
          result_22.m_backend.data._M_elems[0xe] = 0;
          result_22.m_backend.data._M_elems[0xf] = 0;
          result_22.m_backend.data._M_elems[0x10] = 0;
          result_22.m_backend.data._M_elems[0x11] = 0;
          result_22.m_backend.data._M_elems[0x12] = 0;
          result_22.m_backend.data._M_elems[0x13] = 0;
          result_22.m_backend.data._M_elems[0x14] = 0;
          result_22.m_backend.data._M_elems[0x15] = 0;
          result_22.m_backend.data._M_elems[0x16] = 0;
          result_22.m_backend.data._M_elems[0x17] = 0;
          result_22.m_backend.data._M_elems[0x18] = 0;
          result_22.m_backend.data._M_elems[0x19] = 0;
          result_22.m_backend.data._M_elems._104_5_ = 0;
          result_22.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_22.m_backend.exp = 0;
          result_22.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_22.m_backend,&pnVar12->m_backend,&result_1.m_backend);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_1bb0,this);
          bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1b30,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_22.m_backend,&local_1bb0);
          if (bVar3) {
            pdVar5 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_4.m_backend,*pdVar5,(type *)0x0);
            tVar2 = boost::multiprecision::operator<
                              (pnVar12,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&result_4.m_backend);
            if (!tVar2) goto LAB_0042667c;
LAB_004265e5:
            bVar3 = boost::multiprecision::operator==(pnVar13,pnVar12);
            iVar1 = this->m_k;
            cStatus->data[iVar1] = (uint)bVar3 * 2;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      (&(x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,
                       &pnVar12->m_backend);
            cStatus->data[this->m_j] = BASIC;
            pcVar14 = &z2.m_backend;
            pcVar9 = &scale2.m_backend;
          }
          else {
LAB_0042667c:
            iVar1 = this->m_k;
            pnVar8 = (x->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar15 = pnVar8 + iVar1;
            pnVar18 = &local_1c30;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_1c30.m_backend.exp = pnVar8[iVar1].m_backend.exp;
            local_1c30.m_backend.neg = pnVar8[iVar1].m_backend.neg;
            local_1c30.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
            local_1c30.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&pnVar11->m_backend,&pnVar17->m_backend);
            result_24.m_backend.fpclass = cpp_dec_float_finite;
            result_24.m_backend.prec_elem = 0x1c;
            result_24.m_backend.data._M_elems[0] = 0;
            result_24.m_backend.data._M_elems[1] = 0;
            result_24.m_backend.data._M_elems[2] = 0;
            result_24.m_backend.data._M_elems[3] = 0;
            result_24.m_backend.data._M_elems[4] = 0;
            result_24.m_backend.data._M_elems[5] = 0;
            result_24.m_backend.data._M_elems[6] = 0;
            result_24.m_backend.data._M_elems[7] = 0;
            result_24.m_backend.data._M_elems[8] = 0;
            result_24.m_backend.data._M_elems[9] = 0;
            result_24.m_backend.data._M_elems[10] = 0;
            result_24.m_backend.data._M_elems[0xb] = 0;
            result_24.m_backend.data._M_elems[0xc] = 0;
            result_24.m_backend.data._M_elems[0xd] = 0;
            result_24.m_backend.data._M_elems[0xe] = 0;
            result_24.m_backend.data._M_elems[0xf] = 0;
            result_24.m_backend.data._M_elems[0x10] = 0;
            result_24.m_backend.data._M_elems[0x11] = 0;
            result_24.m_backend.data._M_elems[0x12] = 0;
            result_24.m_backend.data._M_elems[0x13] = 0;
            result_24.m_backend.data._M_elems[0x14] = 0;
            result_24.m_backend.data._M_elems[0x15] = 0;
            result_24.m_backend.data._M_elems[0x16] = 0;
            result_24.m_backend.data._M_elems[0x17] = 0;
            result_24.m_backend.data._M_elems[0x18] = 0;
            result_24.m_backend.data._M_elems[0x19] = 0;
            result_24.m_backend.data._M_elems._104_5_ = 0;
            result_24.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_24.m_backend.exp = 0;
            result_24.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_24.m_backend,&pnVar13->m_backend,&result_1.m_backend);
            (*(this->super_PostStep)._vptr_PostStep[7])(&local_1cb0,this);
            bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_1c30,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_24.m_backend,&local_1cb0);
            if (bVar3) {
              pdVar5 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                        (&result_4.m_backend,*pdVar5,(type *)0x0);
              tVar2 = boost::multiprecision::operator<
                                (pnVar17,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&result_4.m_backend);
              if (tVar2) goto LAB_00426793;
            }
            iVar1 = this->m_k;
            pnVar8 = (x->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pnVar15 = pnVar8 + iVar1;
            pnVar18 = &local_1d30;
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              (pnVar18->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
              pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            local_1d30.m_backend.exp = pnVar8[iVar1].m_backend.exp;
            local_1d30.m_backend.neg = pnVar8[iVar1].m_backend.neg;
            local_1d30.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
            local_1d30.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&pnVar11->m_backend,&pnVar17->m_backend);
            result_26.m_backend.fpclass = cpp_dec_float_finite;
            result_26.m_backend.prec_elem = 0x1c;
            result_26.m_backend.data._M_elems[0] = 0;
            result_26.m_backend.data._M_elems[1] = 0;
            result_26.m_backend.data._M_elems[2] = 0;
            result_26.m_backend.data._M_elems[3] = 0;
            result_26.m_backend.data._M_elems[4] = 0;
            result_26.m_backend.data._M_elems[5] = 0;
            result_26.m_backend.data._M_elems[6] = 0;
            result_26.m_backend.data._M_elems[7] = 0;
            result_26.m_backend.data._M_elems[8] = 0;
            result_26.m_backend.data._M_elems[9] = 0;
            result_26.m_backend.data._M_elems[10] = 0;
            result_26.m_backend.data._M_elems[0xb] = 0;
            result_26.m_backend.data._M_elems[0xc] = 0;
            result_26.m_backend.data._M_elems[0xd] = 0;
            result_26.m_backend.data._M_elems[0xe] = 0;
            result_26.m_backend.data._M_elems[0xf] = 0;
            result_26.m_backend.data._M_elems[0x10] = 0;
            result_26.m_backend.data._M_elems[0x11] = 0;
            result_26.m_backend.data._M_elems[0x12] = 0;
            result_26.m_backend.data._M_elems[0x13] = 0;
            result_26.m_backend.data._M_elems[0x14] = 0;
            result_26.m_backend.data._M_elems[0x15] = 0;
            result_26.m_backend.data._M_elems[0x16] = 0;
            result_26.m_backend.data._M_elems[0x17] = 0;
            result_26.m_backend.data._M_elems[0x18] = 0;
            result_26.m_backend.data._M_elems[0x19] = 0;
            result_26.m_backend.data._M_elems._104_5_ = 0;
            result_26.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_26.m_backend.exp = 0;
            result_26.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_26.m_backend,&pnVar13->m_backend,&result_1.m_backend);
            (*(this->super_PostStep)._vptr_PostStep[7])(&local_1db0,this);
            bVar3 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_1d30,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_26.m_backend,&local_1db0);
            if (!bVar3) {
LAB_00426b85:
              iVar1 = this->m_k;
              pnVar8 = (x->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar15 = pnVar8 + iVar1;
              pnVar12 = &local_1e30;
              for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
                (pnVar12->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
                pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
                pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
              }
              local_1e30.m_backend.exp = pnVar8[iVar1].m_backend.exp;
              local_1e30.m_backend.neg = pnVar8[iVar1].m_backend.neg;
              local_1e30.m_backend.fpclass = pnVar8[iVar1].m_backend.fpclass;
              local_1e30.m_backend.prec_elem = pnVar8[iVar1].m_backend.prec_elem;
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1.m_backend,&pnVar11->m_backend,&pnVar17->m_backend);
              result_28.m_backend.fpclass = cpp_dec_float_finite;
              result_28.m_backend.prec_elem = 0x1c;
              result_28.m_backend.data._M_elems[0] = 0;
              result_28.m_backend.data._M_elems[1] = 0;
              result_28.m_backend.data._M_elems[2] = 0;
              result_28.m_backend.data._M_elems[3] = 0;
              result_28.m_backend.data._M_elems[4] = 0;
              result_28.m_backend.data._M_elems[5] = 0;
              result_28.m_backend.data._M_elems[6] = 0;
              result_28.m_backend.data._M_elems[7] = 0;
              result_28.m_backend.data._M_elems[8] = 0;
              result_28.m_backend.data._M_elems[9] = 0;
              result_28.m_backend.data._M_elems[10] = 0;
              result_28.m_backend.data._M_elems[0xb] = 0;
              result_28.m_backend.data._M_elems[0xc] = 0;
              result_28.m_backend.data._M_elems[0xd] = 0;
              result_28.m_backend.data._M_elems[0xe] = 0;
              result_28.m_backend.data._M_elems[0xf] = 0;
              result_28.m_backend.data._M_elems[0x10] = 0;
              result_28.m_backend.data._M_elems[0x11] = 0;
              result_28.m_backend.data._M_elems[0x12] = 0;
              result_28.m_backend.data._M_elems[0x13] = 0;
              result_28.m_backend.data._M_elems[0x14] = 0;
              result_28.m_backend.data._M_elems[0x15] = 0;
              result_28.m_backend.data._M_elems[0x16] = 0;
              result_28.m_backend.data._M_elems[0x17] = 0;
              result_28.m_backend.data._M_elems[0x18] = 0;
              result_28.m_backend.data._M_elems[0x19] = 0;
              result_28.m_backend.data._M_elems._104_5_ = 0;
              result_28.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_28.m_backend.exp = 0;
              result_28.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_28.m_backend,&pnVar13->m_backend,&result_1.m_backend);
              (*(this->super_PostStep)._vptr_PostStep[7])(&local_1eb0,this);
              bVar3 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_1e30,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&result_28.m_backend,&local_1eb0);
              if (!bVar3) {
                pSVar6 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
                std::__cxx11::string::string
                          ((string *)&result_1,"XMAISM09 This should never happen.",
                           (allocator *)&result_4);
                SPxInternalCodeException::SPxInternalCodeException(pSVar6,(string *)&result_1);
                __cxa_throw(pSVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
              }
              bVar3 = boost::multiprecision::operator==
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)pcVar14,pnVar17);
              iVar1 = this->m_j;
              cStatus->data[iVar1] = (uint)bVar3 * 2;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        (&(x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,
                         &pnVar17->m_backend);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 0x1c;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems[6] = 0;
              result_1.m_backend.data._M_elems[7] = 0;
              result_1.m_backend.data._M_elems[8] = 0;
              result_1.m_backend.data._M_elems[9] = 0;
              result_1.m_backend.data._M_elems[10] = 0;
              result_1.m_backend.data._M_elems[0xb] = 0;
              result_1.m_backend.data._M_elems[0xc] = 0;
              result_1.m_backend.data._M_elems[0xd] = 0;
              result_1.m_backend.data._M_elems[0xe] = 0;
              result_1.m_backend.data._M_elems[0xf] = 0;
              result_1.m_backend.data._M_elems[0x10] = 0;
              result_1.m_backend.data._M_elems[0x11] = 0;
              result_1.m_backend.data._M_elems[0x12] = 0;
              result_1.m_backend.data._M_elems[0x13] = 0;
              result_1.m_backend.data._M_elems[0x14] = 0;
              result_1.m_backend.data._M_elems[0x15] = 0;
              result_1.m_backend.data._M_elems[0x16] = 0;
              result_1.m_backend.data._M_elems[0x17] = 0;
              result_1.m_backend.data._M_elems[0x18] = 0;
              result_1.m_backend.data._M_elems[0x19] = 0;
              result_1.m_backend.data._M_elems._104_5_ = 0;
              result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1.m_backend,&pnVar11->m_backend,
                         &(x->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
              pcVar14 = &(x->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
              goto LAB_00426cfd;
            }
            pdVar5 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_4.m_backend,-*pdVar5,(type *)0x0);
            tVar2 = boost::multiprecision::operator>
                              (pnVar13,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&result_4.m_backend);
            if (!tVar2) goto LAB_00426b85;
            bVar3 = boost::multiprecision::operator==(pnVar13,pnVar12);
            iVar1 = this->m_k;
            cStatus->data[iVar1] = bVar3 + ON_LOWER;
            pcVar14 = &(x->val).
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend;
LAB_00426903:
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      (pcVar14,&pnVar13->m_backend);
            cStatus->data[this->m_j] = BASIC;
            pcVar14 = &z1.m_backend;
            pcVar9 = &scale1.m_backend;
          }
          result_4.m_backend.fpclass = cpp_dec_float_finite;
          result_4.m_backend.prec_elem = 0x1c;
          result_4.m_backend.exp = 0;
          result_4.m_backend.neg = false;
          result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_4.m_backend.data._M_elems._104_5_ = 0;
          result_4.m_backend.data._M_elems[0x18] = 0;
          result_4.m_backend.data._M_elems[0x19] = 0;
          result_4.m_backend.data._M_elems[0x16] = 0;
          result_4.m_backend.data._M_elems[0x17] = 0;
          result_4.m_backend.data._M_elems[0x14] = 0;
          result_4.m_backend.data._M_elems[0x15] = 0;
          result_4.m_backend.data._M_elems[0x12] = 0;
          result_4.m_backend.data._M_elems[0x13] = 0;
          result_4.m_backend.data._M_elems[0x10] = 0;
          result_4.m_backend.data._M_elems[0x11] = 0;
          result_4.m_backend.data._M_elems[0xe] = 0;
          result_4.m_backend.data._M_elems[0xf] = 0;
          result_4.m_backend.data._M_elems[0xc] = 0;
          result_4.m_backend.data._M_elems[0xd] = 0;
          result_4.m_backend.data._M_elems[10] = 0;
          result_4.m_backend.data._M_elems[0xb] = 0;
          result_4.m_backend.data._M_elems[8] = 0;
          result_4.m_backend.data._M_elems[9] = 0;
          result_4.m_backend.data._M_elems[6] = 0;
          result_4.m_backend.data._M_elems[7] = 0;
          result_4.m_backend.data._M_elems[4] = 0;
          result_4.m_backend.data._M_elems[5] = 0;
          result_4.m_backend.data._M_elems[2] = 0;
          result_4.m_backend.data._M_elems[3] = 0;
          result_4.m_backend.data._M_elems[0] = 0;
          result_4.m_backend.data._M_elems[1] = 0;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_4.m_backend,pcVar14,pcVar9);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,&result_4.m_backend,&pnVar11->m_backend);
          iVar1 = this->m_j;
          pnVar8 = (x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar14 = &result_1.m_backend;
          pnVar15 = pnVar8 + iVar1;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar15->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
            pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
            pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
          }
          pnVar8[iVar1].m_backend.exp = result_1.m_backend.exp;
          pnVar8[iVar1].m_backend.neg = result_1.m_backend.neg;
          pnVar8[iVar1].m_backend.fpclass = result_1.m_backend.fpclass;
          pnVar8[iVar1].m_backend.prec_elem = result_1.m_backend.prec_elem;
          break;
        }
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&result_4.m_backend,-*pdVar5,(type *)0x0);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_4.m_backend);
        if (!tVar2) goto LAB_004264bc;
        bVar3 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar14,&this->m_upJ);
        iVar1 = this->m_j;
        cStatus->data[iVar1] = bVar3 + ON_LOWER;
        pcVar9 = &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend;
        goto LAB_00426b1a;
      }
      bVar3 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pcVar14,&this->m_upJ);
      iVar1 = this->m_j;
      cStatus->data[iVar1] = bVar3 + ON_LOWER;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                (&(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar1].m_backend,pcVar14);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 0x1c;
      result_1.m_backend.data._M_elems[0] = 0;
      result_1.m_backend.data._M_elems[1] = 0;
      result_1.m_backend.data._M_elems[2] = 0;
      result_1.m_backend.data._M_elems[3] = 0;
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems[6] = 0;
      result_1.m_backend.data._M_elems[7] = 0;
      result_1.m_backend.data._M_elems[8] = 0;
      result_1.m_backend.data._M_elems[9] = 0;
      result_1.m_backend.data._M_elems[10] = 0;
      result_1.m_backend.data._M_elems[0xb] = 0;
      result_1.m_backend.data._M_elems[0xc] = 0;
      result_1.m_backend.data._M_elems[0xd] = 0;
      result_1.m_backend.data._M_elems[0xe] = 0;
      result_1.m_backend.data._M_elems[0xf] = 0;
      result_1.m_backend.data._M_elems[0x10] = 0;
      result_1.m_backend.data._M_elems[0x11] = 0;
      result_1.m_backend.data._M_elems[0x12] = 0;
      result_1.m_backend.data._M_elems[0x13] = 0;
      result_1.m_backend.data._M_elems[0x14] = 0;
      result_1.m_backend.data._M_elems[0x15] = 0;
      result_1.m_backend.data._M_elems[0x16] = 0;
      result_1.m_backend.data._M_elems[0x17] = 0;
      result_1.m_backend.data._M_elems[0x18] = 0;
      result_1.m_backend.data._M_elems[0x19] = 0;
      result_1.m_backend.data._M_elems._104_5_ = 0;
      result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_1.m_backend,&pnVar11->m_backend,
                 &(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
      pcVar14 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (pcVar14,&result_1.m_backend);
  }
  scale1.m_backend.fpclass = cpp_dec_float_finite;
  scale1.m_backend.prec_elem = 0x1c;
  scale1.m_backend.data._M_elems[0] = 0;
  scale1.m_backend.data._M_elems[1] = 0;
  scale1.m_backend.data._M_elems[2] = 0;
  scale1.m_backend.data._M_elems[3] = 0;
  scale1.m_backend.data._M_elems[4] = 0;
  scale1.m_backend.data._M_elems[5] = 0;
  scale1.m_backend.data._M_elems[6] = 0;
  scale1.m_backend.data._M_elems[7] = 0;
  scale1.m_backend.data._M_elems[8] = 0;
  scale1.m_backend.data._M_elems[9] = 0;
  scale1.m_backend.data._M_elems[10] = 0;
  scale1.m_backend.data._M_elems[0xb] = 0;
  scale1.m_backend.data._M_elems[0xc] = 0;
  scale1.m_backend.data._M_elems[0xd] = 0;
  scale1.m_backend.data._M_elems[0xe] = 0;
  scale1.m_backend.data._M_elems[0xf] = 0;
  scale1.m_backend.data._M_elems[0x10] = 0;
  scale1.m_backend.data._M_elems[0x11] = 0;
  scale1.m_backend.data._M_elems[0x12] = 0;
  scale1.m_backend.data._M_elems[0x13] = 0;
  scale1.m_backend.data._M_elems[0x14] = 0;
  scale1.m_backend.data._M_elems[0x15] = 0;
  scale1.m_backend.data._M_elems[0x16] = 0;
  scale1.m_backend.data._M_elems[0x17] = 0;
  scale1.m_backend.data._M_elems[0x18] = 0;
  scale1.m_backend.data._M_elems[0x19] = 0;
  scale1.m_backend.data._M_elems._104_5_ = 0;
  scale1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  scale1.m_backend.exp = 0;
  scale1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&scale1.m_backend,&(this->m_scale).m_backend,
             &(r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend);
  iVar1 = this->m_j;
  pnVar8 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar14 = &scale1.m_backend;
  pnVar15 = pnVar8 + iVar1;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar21 * -8 + 4);
    pnVar15 = (pointer)((long)pnVar15 + ((ulong)bVar21 * -2 + 1) * 4);
  }
  pnVar8[iVar1].m_backend.exp = scale1.m_backend.exp;
  pnVar8[iVar1].m_backend.neg = scale1.m_backend.neg;
  pnVar8[iVar1].m_backend.fpclass = scale1.m_backend.fpclass;
  pnVar8[iVar1].m_backend.prec_elem = scale1.m_backend.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}